

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O2

Var Js::JavascriptSet::EntryForEach(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  MapOrSetDataNode<void_*> *pMVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptSet *pJVar6;
  RecyclableObject *this_00;
  JavascriptMethod p_Var7;
  int in_stack_00000010;
  undefined1 local_90 [8];
  AutoTagNativeLibraryEntry __tag;
  Iterator iterator;
  CallInfo callInfo_local;
  undefined1 local_48 [8];
  ArgumentReader args;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  iterator.current.ptr = (MapOrSetDataNode<void_*> *)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x9e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_48,(CallInfo *)&iterator.current,(Var *)&stack0x00000018);
  args.super_Arguments.Values =
       (Type)(((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_90,function,(CallInfo)iterator.current.ptr,
             L"Set.prototype.forEach",&stack0x00000000);
  pvVar5 = Arguments::operator[]((Arguments *)local_48,0);
  bVar3 = VarIs<Js::JavascriptSet>(pvVar5);
  if (bVar3) {
    pJVar6 = UnsafeVarTo<Js::JavascriptSet>(pvVar5);
    if (pJVar6 != (JavascriptSet *)0x0) {
      if ((local_48._0_4_ & 0xfffffe) != 0) {
        pvVar5 = Arguments::operator[]((Arguments *)local_48,1);
        bVar3 = JavascriptConversion::IsCallable(pvVar5);
        if (bVar3) {
          pvVar5 = Arguments::operator[]((Arguments *)local_48,1);
          this_00 = VarTo<Js::RecyclableObject>(pvVar5);
          if ((local_48._0_4_ & 0xffffff) < 3) {
            callInfo_local = *(CallInfo *)((long)args.super_Arguments.Values[1] + 0x430);
          }
          else {
            callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)local_48,2);
          }
          MapOrSetDataList<void_*>::Iterator::Iterator((Iterator *)&__tag.entry.next,&pJVar6->list);
          while( true ) {
            bVar3 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)&__tag.entry.next);
            if (!bVar3) break;
            pMVar1 = iterator.list.ptr[1].first.ptr;
            this = (ThreadContext *)args.super_Arguments.Values[0x77];
            bVar3 = this->reentrancySafeOrHandled;
            this->reentrancySafeOrHandled = true;
            ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
            ThreadContext::AssertJsReentrancy((ThreadContext *)args.super_Arguments.Values[0x77]);
            p_Var7 = RecyclableObject::GetEntryPoint(this_00);
            CheckIsExecutable(this_00,p_Var7);
            p_Var7 = RecyclableObject::GetEntryPoint(this_00);
            pvVar5 = Arguments::operator[]((Arguments *)local_48,0);
            (*p_Var7)(this_00,(CallInfo)this_00,0x2000004,0,0,0,0,0x2000004,callInfo_local,pMVar1,
                      pMVar1,pvVar5);
            this->reentrancySafeOrHandled = bVar3;
          }
          pvVar5 = *(Var *)((long)args.super_Arguments.Values[1] + 0x430);
          AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry
                    ((AutoTagNativeLibraryEntry *)local_90);
          return pvVar5;
        }
      }
      JavascriptError::ThrowTypeError
                ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ec34,L"Set.prototype.forEach");
    }
  }
  JavascriptError::ThrowTypeErrorVar
            ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ec04,L"Set.prototype.forEach",
             L"Set");
}

Assistant:

Var JavascriptSet::EntryForEach(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Set.prototype.forEach"));

    JavascriptSet* set = JavascriptOperators::TryFromVar<JavascriptSet>(args[0]);
    if (set == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Set.prototype.forEach"), _u("Set"));
    }

    if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Set.prototype.forEach"));
    }
    RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);

    Var thisArg = (args.Info.Count > 2) ? args[2] : scriptContext->GetLibrary()->GetUndefined();

    auto iterator = set->GetIterator();

    while (iterator.Next())
    {
        Var value = iterator.Current();

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg, value, value, args[0]);
        }
        END_SAFE_REENTRANT_CALL
    }

    return scriptContext->GetLibrary()->GetUndefined();
}